

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

Color * sf::operator+=(Color *left,Color *right)

{
  Color CVar1;
  Color *right_local;
  Color *left_local;
  
  CVar1 = operator+(left,right);
  *left = CVar1;
  return left;
}

Assistant:

Color& operator +=(Color& left, const Color& right)
{
    return left = left + right;
}